

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DebugInfo *__ptr;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  DebugInfo *this_00;
  cmake *this_01;
  pointer __p;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> debug;
  cmServerResponse response;
  Value value;
  Value debugValue;
  cmServerRequest request;
  Reader reader;
  DebugInfo *local_2b0;
  string local_2a8;
  undefined1 local_288 [32];
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  Value local_220;
  Value local_1f8;
  Value local_1d0;
  cmServerRequest local_1a8;
  Reader local_130;
  
  Json::Reader::Reader(&local_130);
  Json::Value::Value(&local_1f8,nullValue);
  bVar2 = Json::Reader::parse(&local_130,input,&local_1f8,true);
  if (bVar2) {
    local_2b0 = (DebugInfo *)0x0;
    pVVar4 = Json::Value::operator[](&local_1f8,"debug");
    Json::Value::Value(&local_1d0,pVVar4);
    bVar2 = Json::Value::isNull(&local_1d0);
    if (!bVar2) {
      this_00 = (DebugInfo *)operator_new(0x30);
      DebugInfo::DebugInfo(this_00);
      __ptr = local_2b0;
      local_288._0_8_ = (DebugInfo *)0x0;
      bVar2 = local_2b0 != (DebugInfo *)0x0;
      local_2b0 = this_00;
      if (bVar2) {
        std::default_delete<cmServer::DebugInfo>::operator()
                  ((default_delete<cmServer::DebugInfo> *)&local_2b0,__ptr);
      }
      if ((DebugInfo *)local_288._0_8_ != (DebugInfo *)0x0) {
        std::default_delete<cmServer::DebugInfo>::operator()
                  ((default_delete<cmServer::DebugInfo> *)local_288,(DebugInfo *)local_288._0_8_);
      }
      pVVar4 = Json::Value::operator[](&local_1d0,"dumpToFile");
      Json::Value::asString_abi_cxx11_((string *)local_288,pVVar4);
      std::__cxx11::string::operator=((string *)&local_2b0->OutputFile,(string *)local_288);
      if ((DebugInfo *)local_288._0_8_ != (DebugInfo *)(local_288 + 0x10)) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
      }
      pVVar4 = Json::Value::operator[](&local_1d0,"showStats");
      bVar2 = Json::Value::asBool(pVVar4);
      local_2b0->PrintStatistics = bVar2;
    }
    pVVar4 = Json::Value::operator[](&local_1f8,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_((string *)local_288,pVVar4);
    pVVar4 = Json::Value::operator[](&local_1f8,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_2a8,pVVar4);
    cmServerRequest::cmServerRequest
              (&local_1a8,this,connection,(string *)local_288,&local_2a8,&local_1f8);
    paVar1 = &local_2a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((DebugInfo *)local_288._0_8_ != (DebugInfo *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_1a8);
    if (iVar3 == 0) {
      cmServerResponse::cmServerResponse((cmServerResponse *)local_288,&local_1a8);
      local_2a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"No type given in request.","");
      cmServerResponse::SetError((cmServerResponse *)local_288,&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      WriteResponse(this,connection,(cmServerResponse *)local_288,(DebugInfo *)0x0);
    }
    else {
      cmSystemTools::SetMessageCallback(reportMessage,&local_1a8);
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion((cmServerResponse *)local_288,this,&local_1a8);
        WriteResponse(this,connection,(cmServerResponse *)local_288,local_2b0);
      }
      else {
        this_01 = cmServerProtocol::CMakeInstance(this->Protocol);
        cmake::SetProgressCallback(this_01,reportProgress,&local_1a8);
        (*this->Protocol->_vptr_cmServerProtocol[4])(local_288,this->Protocol,&local_1a8);
        WriteResponse(this,connection,(cmServerResponse *)local_288,local_2b0);
      }
    }
    Json::Value::~Value(&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_p != &local_230) {
      operator_delete(local_240._M_p,local_230._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != &local_258) {
      operator_delete(local_268._M_p,local_258._0_8_ + 1);
    }
    if ((DebugInfo *)local_288._0_8_ != (DebugInfo *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    Json::Value::~Value(&local_1a8.Data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.Cookie._M_dataplus._M_p != &local_1a8.Cookie.field_2) {
      operator_delete(local_1a8.Cookie._M_dataplus._M_p,
                      local_1a8.Cookie.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.Type._M_dataplus._M_p != &local_1a8.Type.field_2) {
      operator_delete(local_1a8.Type._M_dataplus._M_p,
                      local_1a8.Type.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value(&local_1d0);
    if (local_2b0 != (DebugInfo *)0x0) {
      std::default_delete<cmServer::DebugInfo>::operator()
                ((default_delete<cmServer::DebugInfo> *)&local_2b0,local_2b0);
    }
  }
  else {
    local_288._0_8_ = (DebugInfo *)(local_288 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"Failed to parse JSON input.","");
    WriteParseError(this,connection,(string *)local_288);
    if ((DebugInfo *)local_288._0_8_ != (DebugInfo *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
  }
  Json::Value::~Value(&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.commentsBefore_._M_dataplus._M_p != &local_130.commentsBefore_.field_2) {
    operator_delete(local_130.commentsBefore_._M_dataplus._M_p,
                    local_130.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.document_._M_dataplus._M_p != &local_130.document_.field_2) {
    operator_delete(local_130.document_._M_dataplus._M_p,
                    local_130.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_130.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_130);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = std::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type == "") {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(reportMessage,
                                    const_cast<cmServerRequest*>(&request));
  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      reportProgress, const_cast<cmServerRequest*>(&request));
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}